

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_adjoin_maxtrix.h
# Opt level: O2

void __thiscall
adjMaxtrix<char>::CreatGraph(adjMaxtrix<char> *this,char *V,int n,RowColWeight *E,int e)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = 0;
  uVar2 = (ulong)(uint)n;
  if (n < 1) {
    uVar2 = uVar1;
  }
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    InsertVertex(this,V[uVar1]);
  }
  uVar1 = 0;
  uVar2 = (ulong)(uint)e;
  if (e < 1) {
    uVar2 = uVar1;
  }
  for (; uVar2 * 0xc - uVar1 != 0; uVar1 = uVar1 + 0xc) {
    InsertEdge(this,*(int *)((long)&E->row + uVar1),*(int *)((long)&E->col + uVar1),
               *(int *)((long)&E->weight + uVar1));
  }
  return;
}

Assistant:

void adjMaxtrix<dataType>::CreatGraph(dataType V[], int n, RowColWeight E[], int e)
{
	int i, k;
	//Initiate(n);	//顶点顺序表初始化
	for (i = 0; i < n; i++)
		InsertVertex(V[i]);	//插入顶点
	for (k = 0; k < e; k++)
		InsertEdge(E[k].row, E[k].col, E[k].weight);//插入边
}